

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O3

void test_openssl_1_0_1f(uchar *test_case,int len)

{
  SSL s;
  SSL local_38;
  
  printf("\nTEST : %s\n","void test_openssl_1_0_1f(unsigned char *, int)");
  local_38.s3 = (S3 *)malloc(0x10);
  ((local_38.s3)->rrec).data = test_case;
  ((local_38.s3)->rrec).length = len;
  local_38.msg_callback = (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0;
  dtls1_process_heartbeat(&local_38);
  return;
}

Assistant:

void test_openssl_1_0_1f(unsigned char *test_case, int len) {
  printf("\nTEST : %s\n", __PRETTY_FUNCTION__);
  SSL s;
  s.s3 = malloc(sizeof(S3));
  s.s3->rrec.data = test_case;
  s.s3->rrec.length = len;
  s.msg_callback = NULL;
  dtls1_process_heartbeat(&s);
}